

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O2

int __thiscall
cinatra::http_parser::parse_response(http_parser *this,char *data,size_t size,int last_len)

{
  int iVar1;
  int minor_version;
  size_t msg_len;
  char *msg;
  
  this->num_headers_ = 100;
  iVar1 = cinatra::detail::phr_parse_response
                    (data,size,&minor_version,&this->status_,&msg,&msg_len,(this->headers_)._M_elems
                     ,&this->num_headers_,(long)last_len);
  this->header_len_ = iVar1;
  (this->msg_)._M_len = msg_len;
  (this->msg_)._M_str = msg;
  parse_body_len(this);
  iVar1 = this->header_len_;
  if ((iVar1 < 0) && (this->num_headers_ == 100)) {
    output_error(this);
    iVar1 = this->header_len_;
  }
  return iVar1;
}

Assistant:

int parse_response(const char *data, size_t size, int last_len) {
    int minor_version;

    num_headers_ = CINATRA_MAX_HTTP_HEADER_FIELD_SIZE;
    const char *msg;
    size_t msg_len;
    header_len_ = cinatra::detail::phr_parse_response(
        data, size, &minor_version, &status_, &msg, &msg_len, headers_.data(),
        &num_headers_, last_len);
    msg_ = {msg, msg_len};
    parse_body_len();
    if (header_len_ < 0) [[unlikely]] {
      CINATRA_LOG_WARNING << "parse http head failed";
      if (num_headers_ == CINATRA_MAX_HTTP_HEADER_FIELD_SIZE) {
        output_error();
      }
    }
    return header_len_;
  }